

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_RsbFree(Gia_RsbMan_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pVVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  pVVar1 = p->vActive;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vObjs;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vObjs2;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vSets[0];
  if (0 < pVVar2->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar2->pArray->nCap + lVar5);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar2->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar2->nCap);
  }
  if (pVVar2->pArray != (Vec_Int_t *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (Vec_Int_t *)0x0;
  }
  pVVar2->nCap = 0;
  pVVar2->nSize = 0;
  free(pVVar2);
  pVVar2 = p->vSets[1];
  if (0 < pVVar2->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar2->pArray->nCap + lVar5);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar2->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar2->nCap);
  }
  if (pVVar2->pArray != (Vec_Int_t *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (Vec_Int_t *)0x0;
  }
  pVVar2->nCap = 0;
  pVVar2->nSize = 0;
  free(pVVar2);
  if (p->pSet[0] != (word *)0x0) {
    free(p->pSet[0]);
    p->pSet[0] = (word *)0x0;
  }
  if (p->pSet[1] != (word *)0x0) {
    free(p->pSet[1]);
    p->pSet[1] = (word *)0x0;
  }
  if (p->pSet[2] != (word *)0x0) {
    free(p->pSet[2]);
    p->pSet[2] = (word *)0x0;
  }
  if (p != (Gia_RsbMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_RsbFree( Gia_RsbMan_t * p )
{
    Vec_IntFree( p->vActive );
    Vec_IntFree( p->vObjs );
    Vec_IntFree( p->vObjs2 );
    Vec_WecFree( p->vSets[0] );
    Vec_WecFree( p->vSets[1] );
    ABC_FREE( p->pSet[0] );
    ABC_FREE( p->pSet[1] );
    ABC_FREE( p->pSet[2] );
    ABC_FREE( p );
}